

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughColorMapMonoToMonoFB *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  long lVar5;
  string texturecolormap_prefix;
  string type_prefix;
  string next_prefix;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string texturecolormap_array_prefix;
  ostringstream oss_textureColorMap_array;
  ostringstream oss_textureColorMap;
  
  PointerToHexString<XrPassthroughColorMapMonoToMonoFB>
            ((XrPassthroughColorMapMonoToMonoFB *)texturecolormap_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_textureColorMap_array);
  std::__cxx11::string::~string((string *)&oss_textureColorMap_array);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_textureColorMap_array,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_textureColorMap_array);
    std::__cxx11::string::~string((string *)&oss_textureColorMap_array);
  }
  else {
    _oss_textureColorMap_array = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_textureColorMap_array);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_textureColorMap_array);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_388,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_388,contents);
  std::__cxx11::string::~string((string *)&local_388);
  if (bVar2) {
    std::__cxx11::string::string((string *)&texturecolormap_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&texturecolormap_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_textureColorMap_array);
    poVar4 = std::operator<<((ostream *)&oss_textureColorMap_array,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::operator<<(poVar4,(char *)value->textureColorMap);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])0x211dfa,&texturecolormap_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_textureColorMap);
    std::__cxx11::string::~string((string *)&oss_textureColorMap);
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      std::__cxx11::string::string
                ((string *)&texturecolormap_array_prefix,(string *)&texturecolormap_prefix);
      std::__cxx11::string::append((char *)&texturecolormap_array_prefix);
      std::__cxx11::to_string((string *)&oss_textureColorMap,(uint)lVar5);
      std::__cxx11::string::append((string *)&texturecolormap_array_prefix);
      std::__cxx11::string::~string((string *)&oss_textureColorMap);
      std::__cxx11::string::append((char *)&texturecolormap_array_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_textureColorMap);
      poVar4 = std::operator<<((ostream *)&oss_textureColorMap,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::operator<<(poVar4,value->textureColorMap[lVar5]);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [8])"uint8_t",&texturecolormap_array_prefix,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_textureColorMap);
      std::__cxx11::string::~string((string *)&texturecolormap_array_prefix);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_textureColorMap_array);
    std::__cxx11::string::~string((string *)&texturecolormap_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughColorMapMonoToMonoFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string texturecolormap_prefix = prefix;
        texturecolormap_prefix += "textureColorMap";
        std::ostringstream oss_textureColorMap_array;
        oss_textureColorMap_array << "0x" << std::hex << (value->textureColorMap);
        contents.emplace_back("uint8_t*", texturecolormap_prefix, oss_textureColorMap_array.str());
        for (uint32_t value_texturecolormap_inc = 0; value_texturecolormap_inc < XR_PASSTHROUGH_COLOR_MAP_MONO_SIZE_FB; ++value_texturecolormap_inc) {
            std::string texturecolormap_array_prefix = texturecolormap_prefix;
            texturecolormap_array_prefix += "[";
            texturecolormap_array_prefix += std::to_string(value_texturecolormap_inc);
            texturecolormap_array_prefix += "]";
            std::ostringstream oss_textureColorMap;
            oss_textureColorMap << "0x" << std::hex << (value->textureColorMap[value_texturecolormap_inc]);
            contents.emplace_back("uint8_t", texturecolormap_array_prefix, oss_textureColorMap.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}